

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O3

void __thiscall Pl_Buffer::~Pl_Buffer(Pl_Buffer *this)

{
  ~Pl_Buffer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Buffer::~Pl_Buffer() = default;